

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.h
# Opt level: O0

void __thiscall
spvtools::val::BasicBlock::RegisterStructuralSuccessor(BasicBlock *this,BasicBlock *block)

{
  BasicBlock *local_20;
  BasicBlock *local_18;
  BasicBlock *block_local;
  BasicBlock *this_local;
  
  local_20 = this;
  local_18 = block;
  block_local = this;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            (&block->structural_predecessors_,&local_20);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            (&this->structural_successors_,&local_18);
  return;
}

Assistant:

void RegisterStructuralSuccessor(BasicBlock* block) {
    block->structural_predecessors_.push_back(this);
    structural_successors_.push_back(block);
  }